

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_gibhealth_I_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = params[1].i;
  bVar2 = DObject::IsKindOf((DObject *)info,PClassActor::RegistrationInfo.MyClass);
  if (bVar2) {
    info->GibHealth = iVar1;
    return;
  }
  __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassActor))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                ,0x240,
                "void Handler_gibhealth_I_Actor(AActor *, PClassActor *, Baggage &, FPropParam *)");
}

Assistant:

DEFINE_PROPERTY(gibhealth, I, Actor)
{
	PROP_INT_PARM(id, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassActor)));
	static_cast<PClassActor *>(info)->GibHealth = id;
}